

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall
FxCompoundStatement::Resolve(FxCompoundStatement *this,FCompileContext *ctx)

{
  FxCompoundStatement *pFVar1;
  FxExpression *pFVar2;
  
  pFVar1 = ctx->Block;
  this->Outer = pFVar1;
  ctx->Block = this;
  pFVar2 = FxSequence::Resolve(&this->super_FxSequence,ctx);
  ctx->Block = pFVar1;
  return pFVar2;
}

Assistant:

FxExpression *FxCompoundStatement::Resolve(FCompileContext &ctx)
{
	auto outer = ctx.Block;
	Outer = ctx.Block;
	ctx.Block = this;
	auto x = FxSequence::Resolve(ctx);
	ctx.Block = outer;
	return x;
}